

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O1

insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
__thiscall
glu::(anonymous_namespace)::
namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
          (_anonymous_namespace_ *this,Functions *gl,deUint32 program,VertexArrayBinding *first,
          VertexArrayBinding *end,
          insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
          out)

{
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *in_RAX;
  iterator iVar1;
  iterator iVar2;
  undefined4 in_register_00000014;
  _Iter _Var3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  const_iterator in_R9;
  VertexArrayBinding *__x;
  undefined1 auVar5 [16];
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  iVar6;
  undefined1 local_a0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  void *pvStack_38;
  
  _Var3._M_current = (VertexArrayBinding *)CONCAT44(in_register_00000014,program);
  if (_Var3._M_current != first) {
    __x = _Var3._M_current;
    local_a0._24_8_ = this;
    do {
      if ((__x->binding).type == TYPE_NAME) {
        auVar5 = (**(code **)(local_a0._24_8_ + 0x780))
                           ((int)gl,(__x->binding).name._M_dataplus._M_p);
        if (-1 < auVar5._0_4_) {
          local_a0._16_4_ = auVar5._0_4_ + (__x->binding).location;
          local_a0[0] = TYPE_LOCATION;
          local_a0._32_4_ = 0;
          local_78[0] = &local_68;
          std::__cxx11::string::_M_construct<char*>((string *)local_78,local_a0);
          local_58 = local_a0._16_4_;
          local_50._0_4_ = (__x->pointer).componentType;
          local_50._4_4_ = (__x->pointer).convert;
          uStack_48._0_4_ = (__x->pointer).numComponents;
          uStack_48._4_4_ = (__x->pointer).numElements;
          local_40 = *(undefined8 *)&(__x->pointer).stride;
          pvStack_38 = (__x->pointer).data;
          iVar1 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                  _M_insert_rval(end,in_R9,(value_type *)(local_a0 + 0x20));
          uVar4 = extraout_RDX;
          if (local_78[0] != &local_68) {
            operator_delete(local_78[0],local_68._M_allocated_capacity + 1);
            uVar4 = extraout_RDX_00;
          }
          iVar2._M_current = (VertexArrayBinding *)local_a0;
          goto LAB_009b69ee;
        }
      }
      else {
        iVar2 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                insert(end,in_R9,__x);
        uVar4 = extraout_RDX_01;
        iVar1 = iVar2;
LAB_009b69ee:
        auVar5._8_8_ = uVar4;
        auVar5._0_8_ = iVar2._M_current;
        in_R9._M_current = iVar1._M_current + 1;
      }
      _Var3._M_current = auVar5._8_8_;
      in_RAX = auVar5._0_8_;
      __x = __x + 1;
    } while (__x != first);
  }
  iVar6.iter._M_current = _Var3._M_current;
  iVar6.container = in_RAX;
  return iVar6;
}

Assistant:

static OutputIter namedBindingsToProgramLocations (const glw::Functions& gl, deUint32 program, InputIter first, InputIter end, OutputIter out)
{
	for (InputIter cur = first; cur != end; ++cur)
	{
		const BindingPoint& binding = cur->binding;
		if (binding.type == BindingPoint::TYPE_NAME)
		{
			DE_ASSERT(binding.location >= 0);
			int location = gl.getAttribLocation(program, binding.name.c_str());
			if (location >= 0)
			{
				// Add binding.location as an offset to accommodate matrices.
				*out = VertexArrayBinding(BindingPoint(location + binding.location), cur->pointer);
				++out;
			}
		}
		else
		{
			*out = *cur;
			++out;
		}
	}

	return out;
}